

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O1

Status __thiscall HighsLpRelaxation::run(HighsLpRelaxation *this,bool resolve_on_error)

{
  Highs *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  double dVar3;
  HighsModelStatus model_status;
  HighsOptions *pHVar4;
  HighsStatus HVar5;
  HighsInt HVar6;
  Status SVar7;
  ulong uVar8;
  size_t in_RCX;
  long lVar9;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  int iVar10;
  uint uVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar12;
  Highs ipm;
  string local_55b8;
  double local_5598;
  double local_5590;
  HighsLp local_5588;
  Highs local_51f0;
  
  HighsTimer::read(&(this->lpsolver).timer_,0,in_RDX,in_RCX);
  local_5590 = (this->mipsolver->options_mip_->super_HighsOptionsStruct).time_limit;
  HighsTimer::read(&this->mipsolver->timer_,0,__buf,in_RCX);
  pvVar2 = &local_51f0.solution_.col_value;
  local_5598 = extraout_XMM0_Qa_00;
  local_51f0._vptr_Highs = (_func_int **)pvVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_51f0,"time_limit","");
  this_00 = &this->lpsolver;
  local_5598 = (extraout_XMM0_Qa + local_5590) - local_5598;
  dVar12 = 0.0;
  if (0.0 <= local_5598) {
    dVar12 = local_5598;
  }
  Highs::setOptionValue(this_00,(string *)&local_51f0,dVar12);
  if ((vector<double,_std::allocator<double>_> *)local_51f0._vptr_Highs != pvVar2) {
    operator_delete(local_51f0._vptr_Highs);
  }
  uVar11 = (uint)(this->lpsolver).basis_.valid;
  iVar10 = 0x3a - uVar11;
  HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,iVar10);
  HVar5 = Highs::run(this_00);
  HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,iVar10);
  if (((uVar11 == 0) && ((this->mipsolver->analysis_).analyse_mip_time != false)) &&
     (HVar6 = HighsMipAnalysis::mipTimerNumCall(&this->mipsolver->analysis_,iVar10), HVar6 == 1)) {
    pHVar4 = this->mipsolver->options_mip_;
    HighsTimer::read(&this->mipsolver->timer_,0,__buf_00,in_RCX);
    highsLogUser(&(pHVar4->super_HighsOptionsStruct).log_options,kInfo,
                 "MIP-Timing: %11.2g - return from first root LP solve\n");
  }
  uVar11 = (this->lpsolver).info_.super_HighsInfoStruct.simplex_iteration_count;
  uVar8 = 0;
  if (0 < (int)uVar11) {
    uVar8 = (ulong)uVar11;
  }
  this->numlpiters = this->numlpiters + uVar8;
  if (HVar5 == kError) {
    Highs::clearSolver(this_00);
    if (!resolve_on_error) {
      recoverBasis(this);
      return kError;
    }
    pvVar2 = &local_51f0.solution_.col_value;
    local_51f0._vptr_Highs = (_func_int **)pvVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_51f0,"simplex_strategy","");
    Highs::setOptionValue(this_00,(string *)&local_51f0,1);
    if ((vector<double,_std::allocator<double>_> *)local_51f0._vptr_Highs != pvVar2) {
      operator_delete(local_51f0._vptr_Highs);
    }
    local_51f0._vptr_Highs = (_func_int **)pvVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_51f0,"presolve","");
    Highs::setOptionValue(this_00,(string *)&local_51f0,&::kHighsOnString_abi_cxx11_);
    if ((vector<double,_std::allocator<double>_> *)local_51f0._vptr_Highs != pvVar2) {
      operator_delete(local_51f0._vptr_Highs);
    }
    SVar7 = run(this,false);
    local_51f0._vptr_Highs = (_func_int **)pvVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_51f0,"presolve","");
    Highs::setOptionValue(this_00,(string *)&local_51f0,&::kHighsOffString_abi_cxx11_);
    if ((vector<double,_std::allocator<double>_> *)local_51f0._vptr_Highs == pvVar2) {
      return SVar7;
    }
LAB_002b2585:
    operator_delete(local_51f0._vptr_Highs);
    return SVar7;
  }
  model_status = (this->lpsolver).model_status_;
  SVar7 = kError;
  iVar10 = (int)uVar8;
  switch(model_status) {
  case kInfeasible:
    lVar9 = this->numSolved + 1;
    this->numSolved = lVar9;
    this->avgSolveIters =
         ((double)iVar10 - this->avgSolveIters) / (double)lVar9 + this->avgSolveIters;
    storeDualInfProof(this);
    goto LAB_002b28f8;
  default:
    pHVar4 = this->mipsolver->options_mip_;
    Highs::modelStatusToString_abi_cxx11_((string *)&local_51f0,this_00,model_status);
    highsLogUser(&(pHVar4->super_HighsOptionsStruct).log_options,kWarning,
                 "LP solved to unexpected status: %s\n",local_51f0._vptr_Highs);
    if ((vector<double,_std::allocator<double>_> *)local_51f0._vptr_Highs ==
        &local_51f0.solution_.col_value) {
      return kError;
    }
    goto LAB_002b2585;
  case kUnbounded:
    if ((this->lpsolver).info_.super_HighsInfoStruct.basis_validity == 0) {
      highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kWarning,
                   "HighsLpRelaxation::run LP is unbounded with no basis, but not returning Status::kError\n"
                  );
    }
    SVar7 = kUnbounded;
    if ((this->lpsolver).info_.super_HighsInfoStruct.primal_solution_status == 2) {
      HighsMipSolverData::trySolution
                ((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
                 &(this->lpsolver).solution_.col_value,9);
    }
    break;
  case kObjectiveBound:
    lVar9 = this->numSolved + 1;
    this->numSolved = lVar9;
    this->avgSolveIters =
         ((double)iVar10 - this->avgSolveIters) / (double)lVar9 + this->avgSolveIters;
    storeDualUBProof(this);
LAB_002b28f8:
    SVar7 = kInfeasible;
    break;
  case kTimeLimit:
    break;
  case kIterationLimit:
    if ((resolve_on_error) && (this->mipsolver->submip == false)) {
      Highs::Highs(&local_51f0);
      paVar1 = &local_55b8.field_2;
      local_55b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_55b8,"output_flag","");
      Highs::setOptionValue(&local_51f0,&local_55b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_55b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_55b8._M_dataplus._M_p);
      }
      local_55b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_55b8,"solver","");
      Highs::setOptionValue(&local_51f0,&local_55b8,"ipm");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_55b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_55b8._M_dataplus._M_p);
      }
      local_55b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_55b8,"ipm_iteration_limit","");
      Highs::setOptionValue(&local_51f0,&local_55b8,200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_55b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_55b8._M_dataplus._M_p);
      }
      if ((this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_root_presolve_only == true)
      {
        local_55b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_55b8,"presolve","");
        Highs::setOptionValue(&local_51f0,&local_55b8,&::kHighsOffString_abi_cxx11_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_55b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_55b8._M_dataplus._M_p);
        }
      }
      HighsLp::HighsLp(&local_5588,&(this->lpsolver).model_.lp_);
      Highs::passModel(&local_51f0,&local_5588);
      HighsLp::~HighsLp(&local_5588);
      local_55b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_55b8,"simplex_iteration_limit","");
      Highs::setOptionValue
                (&local_51f0,&local_55b8,
                 (this->lpsolver).info_.super_HighsInfoStruct.simplex_iteration_count);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_55b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_55b8._M_dataplus._M_p);
      }
      HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,0x3b);
      Highs::run(&local_51f0);
      HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0x3b);
      local_55b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_55b8,"HighsLpRelaxation::run IPM basis","");
      Highs::setBasis(this_00,&local_51f0.basis_,&local_55b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_55b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_55b8._M_dataplus._M_p);
      }
      SVar7 = run(this,false);
      Highs::~Highs(&local_51f0);
    }
    break;
  case kUnknown:
    if ((this->lpsolver).info_.super_HighsInfoStruct.basis_validity == 0) {
      return kError;
    }
  case kOptimal:
    lVar9 = this->numSolved + 1;
    this->numSolved = lVar9;
    this->avgSolveIters =
         ((double)iVar10 - this->avgSolveIters) / (double)lVar9 + this->avgSolveIters;
    dVar12 = (this->lpsolver).info_.super_HighsInfoStruct.max_primal_infeasibility;
    dVar3 = ((this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    if (dVar3 < dVar12) {
      SVar7 = kUnscaledDualFeasible;
      if (dVar3 < (this->lpsolver).info_.super_HighsInfoStruct.max_dual_infeasibility) {
        SVar7 = (uint)(model_status != kOptimal) * 2 + kUnscaledInfeasible;
      }
    }
    else {
      SVar7 = (-(uint)(dVar3 < (this->lpsolver).info_.super_HighsInfoStruct.max_dual_infeasibility
                      || dVar3 < dVar12) & 1) * 3 + kOptimal;
    }
  }
  return SVar7;
}

Assistant:

HighsLpRelaxation::Status HighsLpRelaxation::run(bool resolve_on_error) {
  const double this_time_limit =
      std::max(lpsolver.getRunTime() + mipsolver.options_mip_->time_limit -
                   mipsolver.timer_.read(),
               0.0);
  lpsolver.setOptionValue("time_limit", this_time_limit);
  // lpsolver.setOptionValue("output_flag", true);
  const bool valid_basis = lpsolver.getBasis().valid;
  const HighsInt simplex_solve_clock = valid_basis
                                           ? kMipClockSimplexBasisSolveLp
                                           : kMipClockSimplexNoBasisSolveLp;
  const bool dev_report = false;
  if (dev_report && !mipsolver.submip) {
    if (valid_basis) {
      printf("Solving LP (%7d, %7d) with    a valid basis\n",
             int(lpsolver.getNumCol()), int(lpsolver.getNumRow()));
    } else {
      printf("Solving LP (%7d, %7d) without a valid basis\n",
             int(lpsolver.getNumCol()), int(lpsolver.getNumRow()));
    }
  }
  const bool solver_logging = false;
  const bool detailed_simplex_logging = false;
  if (solver_logging) lpsolver.setOptionValue("output_flag", true);
  if (detailed_simplex_logging) {
    lpsolver.setOptionValue("output_flag", true);
    lpsolver.setOptionValue("log_dev_level", kHighsLogDevLevelVerbose);
    lpsolver.setOptionValue("highs_analysis_level",
                            kHighsAnalysisLevelSolverRuntimeData);
  }

  mipsolver.analysis_.mipTimerStart(simplex_solve_clock);
  HighsStatus callstatus = lpsolver.run();
  mipsolver.analysis_.mipTimerStop(simplex_solve_clock);
  if (mipsolver.analysis_.analyse_mip_time && !valid_basis &&
      mipsolver.analysis_.mipTimerNumCall(simplex_solve_clock) == 1)
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "MIP-Timing: %11.2g - return from first root LP solve\n",
                 mipsolver.timer_.read());
  const HighsInfo& info = lpsolver.getInfo();
  HighsInt itercount = std::max(HighsInt{0}, info.simplex_iteration_count);
  numlpiters += itercount;

  if (callstatus == HighsStatus::kError) {
    lpsolver.clearSolver();
#if 0
    // first try to use the primal simplex solver starting from the last basis
    if (lpsolver.getOptions().simplex_strategy == kSimplexStrategyDual) {
      lpsolver.setOptionValue("simplex_strategy", kSimplexStrategyPrimal);
      recoverBasis();
      auto retval = run(resolve_on_error);
      lpsolver.setOptionValue("simplex_strategy", kSimplexStrategyDual);

      return retval;
    }
#endif

    if (resolve_on_error) {
      // still an error: now try to solve with presolve from scratch
      lpsolver.setOptionValue("simplex_strategy", kSimplexStrategyDual);
      lpsolver.setOptionValue("presolve", kHighsOnString);
      auto retval = run(false);
      lpsolver.setOptionValue("presolve", kHighsOffString);

      return retval;
    }

    recoverBasis();

    return Status::kError;
  }

  // Was
  //  HighsModelStatus scaledmodelstatus = lpsolver.getModelStatus(true);
  HighsModelStatus model_status = lpsolver.getModelStatus();
  switch (model_status) {
    case HighsModelStatus::kObjectiveBound:
      ++numSolved;
      avgSolveIters +=
          (itercount - avgSolveIters) / static_cast<double>(numSolved);

      storeDualUBProof();
      return Status::kInfeasible;
    case HighsModelStatus::kInfeasible: {
      ++numSolved;
      avgSolveIters +=
          (itercount - avgSolveIters) / static_cast<double>(numSolved);

      storeDualInfProof();
      if (true || checkDualProof()) return Status::kInfeasible;
      // /printf("infeasibility proof not valid\n");
      hasdualproof = false;

      // HighsInt scalestrategy = lpsolver.getOptions().simplex_scale_strategy;
      // if (scalestrategy != kSimplexScaleStrategyOff) {
      //   lpsolver.setOptionValue("simplex_scale_strategy",
      //                           kSimplexScaleStrategyOff);
      //   HighsBasis basis = lpsolver.getBasis();
      //   lpsolver.clearSolver();
      //   lpsolver.setBasis(basis);
      //   auto tmp = run(resolve_on_error);
      //   lpsolver.setOptionValue("simplex_scale_strategy", scalestrategy);
      //   if (!scaledOptimal(tmp)) {
      //     lpsolver.clearSolver();
      //     lpsolver.setBasis(basis);
      //   }
      //   return tmp;
      // }
      //
      // // trust the primal simplex result without scaling
      // if (lpsolver.getModelStatus() == HighsModelStatus::kInfeasible)
      //   return Status::kInfeasible;

      // highsLogUser(mipsolver.options_mip_->log_options,
      //                 HighsLogType::kWarning,
      //                 "LP failed to reliably determine infeasibility\n");

      // printf("error: unreliable infeasibilities, modelstatus = %"
      // HIGHSINT_FORMAT " (scaled
      // %" HIGHSINT_FORMAT ")\n",
      //        (HighsInt)lpsolver.getModelStatus(),
      //        (HighsInt)lpsolver.getModelStatus(true));
      return Status::kError;
    }
    case HighsModelStatus::kUnbounded:
      // If unboundedness is detected in the presolved LP, then
      // postsolve cannot be run, so there is no basis. Returning
      // Status::kError as a result yielded #1962, where the root node
      // is unbounded.
      if (info.basis_validity == kBasisValidityInvalid)
        highsLogUser(mipsolver.options_mip_->log_options,
                     HighsLogType::kWarning,
                     "HighsLpRelaxation::run LP is unbounded with no basis, "
                     "but not returning Status::kError\n");
      if (info.primal_solution_status == kSolutionStatusFeasible)
        mipsolver.mipdata_->trySolution(lpsolver.getSolution().col_value,
                                        kSolutionSourceUnbounded);

      return Status::kUnbounded;
    case HighsModelStatus::kUnknown:
      if (info.basis_validity == kBasisValidityInvalid) return Status::kError;
      // fall through
    case HighsModelStatus::kOptimal:
      assert(info.max_primal_infeasibility >= 0);
      assert(info.max_dual_infeasibility >= 0);
      ++numSolved;
      avgSolveIters +=
          (itercount - avgSolveIters) / static_cast<double>(numSolved);
      if (info.max_primal_infeasibility <= mipsolver.mipdata_->feastol &&
          info.max_dual_infeasibility <= mipsolver.mipdata_->feastol)
        return Status::kOptimal;

      if (info.max_primal_infeasibility <= mipsolver.mipdata_->feastol)
        return Status::kUnscaledPrimalFeasible;

      if (info.max_dual_infeasibility <= mipsolver.mipdata_->feastol)
        return Status::kUnscaledDualFeasible;

      if (model_status == HighsModelStatus::kOptimal)
        return Status::kUnscaledInfeasible;

      return Status::kError;
    case HighsModelStatus::kIterationLimit: {
      if (!mipsolver.submip && resolve_on_error) {
        // printf(
        //     "error: lpsolver reached iteration limit, resolving with basis "
        //     "from ipm\n");
        Highs ipm;
        ipm.setOptionValue("output_flag", false);
        ipm.setOptionValue("solver", "ipm");
        ipm.setOptionValue("ipm_iteration_limit", 200);
        // check if only root presolve is allowed
        if (mipsolver.options_mip_->mip_root_presolve_only)
          ipm.setOptionValue("presolve", kHighsOffString);
        ipm.passModel(lpsolver.getLp());
        // todo @ Julian : If you remove this you can see the looping on
        // istanbul-no-cutoff
        ipm.setOptionValue("simplex_iteration_limit",
                           info.simplex_iteration_count);
        mipsolver.analysis_.mipTimerStart(kMipClockIpmSolveLp);
        ipm.run();
        mipsolver.analysis_.mipTimerStop(kMipClockIpmSolveLp);
        lpsolver.setBasis(ipm.getBasis(), "HighsLpRelaxation::run IPM basis");
        return run(false);
      }

      // printf("error: lpsolver reached iteration limit\n");
      return Status::kError;
    }
    case HighsModelStatus::kTimeLimit:
      return Status::kError;
    default:
      // printf("error: lpsolver stopped with unexpected status %"
      // HIGHSINT_FORMAT "\n",
      //        (HighsInt)model_status);
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kWarning,
                   "LP solved to unexpected status: %s\n",
                   lpsolver.modelStatusToString(model_status).c_str());
      return Status::kError;
  }
}